

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_function_set.cpp
# Opt level: O1

optional_ptr<duckdb::MapCastNode,_true> __thiscall
duckdb::MapCastInfo::GetEntry(MapCastInfo *this,LogicalType *source,LogicalType *target)

{
  _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  bool bVar1;
  bool bVar2;
  _Node_iterator_base<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>_>_>,_true>
  _Var3;
  _Node_iterator_base<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_true>
  _Var4;
  LogicalType *pLVar5;
  LogicalType *pLVar6;
  LogicalType *pLVar7;
  _Node_iterator_base<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_true>
  _Var8;
  _Node_iterator_base<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_true> _Var9;
  _Hashtable<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeIdEquality,_duckdb::LogicalTypeIdHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_02;
  MapCastNode *pMVar10;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  __l;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  __l_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  __l_01;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  __l_02;
  allocator_type local_b9;
  LogicalType local_b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [24];
  child_list_t<LogicalType> local_68;
  LogicalType *local_50;
  LogicalType local_48;
  
  local_a0[0] = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                 )source->id_;
  _Var3._M_cur = (__node_type *)
                 ::std::_Hashtable<$3d859558$>::find(&(this->casts)._M_h,(key_type *)local_a0);
  if (_Var3._M_cur == (__node_type *)0x0) {
    local_a0[0] = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                   )0x3;
    _Var3._M_cur = (__node_type *)
                   ::std::_Hashtable<$3d859558$>::find(&(this->casts)._M_h,(key_type *)local_a0);
    if (_Var3._M_cur != (__node_type *)0x0) goto LAB_00f36707;
    goto LAB_00f36c9d;
  }
LAB_00f36707:
  this_00 = (_Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(&((_Var3._M_cur)->
                 super__Hash_node_value<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>_>_>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>_>_>_>
                 ._M_storage._M_storage.__align + 1);
  _Var4._M_cur = (__node_type *)
                 ::std::
                 _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(this_00,source);
  if (_Var4._M_cur != (__node_type *)0x0) goto LAB_00f369c5;
  switch(source->id_) {
  case STRUCT:
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
    ::pair<const_char_(&)[4],_const_duckdb::LogicalTypeId_&,_true>
              (local_a0,(char (*) [4])0x1dcb016,&LogicalType::ANY);
    __l._M_len = 1;
    __l._M_array = (iterator)local_a0;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_68,__l,(allocator_type *)&local_48);
    LogicalType::STRUCT(&local_b8,&local_68);
    _Var4._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_00,&local_b8);
    break;
  case LIST:
    LogicalType::LogicalType(&local_b8,ANY);
    LogicalType::LIST((LogicalType *)local_a0,&local_b8);
    _Var4._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_00,(key_type *)local_a0);
    goto LAB_00f369a5;
  case MAP:
    _Var4._M_cur = *(__node_type **)
                    ((long)&((_Var3._M_cur)->
                            super__Hash_node_value<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>_>_>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>_>_>_>
                            ._M_storage._M_storage + 0x18);
    if (_Var4._M_cur != (__node_type *)0x0) {
      local_50 = target;
      do {
        if (((_Var4._M_cur)->
            super__Hash_node_value<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_true>
            ).
            super__Hash_node_value_base<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>
            ._M_storage._M_storage.__data[0] == 'f') {
          pLVar5 = MapType::KeyType((LogicalType *)
                                    &(_Var4._M_cur)->
                                     super__Hash_node_value<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_true>
                                   );
          pLVar6 = MapType::ValueType((LogicalType *)
                                      &(_Var4._M_cur)->
                                       super__Hash_node_value<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_true>
                                     );
          LogicalType::LogicalType((LogicalType *)local_a0,ANY);
          bVar1 = LogicalType::operator==(pLVar5,(LogicalType *)local_a0);
          if (bVar1) {
LAB_00f36837:
            LogicalType::LogicalType(&local_48,ANY);
            bVar2 = LogicalType::operator==(pLVar6,&local_48);
            target = local_50;
            bVar1 = true;
            if (bVar2) {
              bVar2 = true;
            }
            else {
              pLVar5 = MapType::ValueType(source);
              bVar2 = LogicalType::operator==(pLVar6,pLVar5);
            }
          }
          else {
            pLVar7 = MapType::KeyType(source);
            bVar1 = LogicalType::operator==(pLVar5,pLVar7);
            if (bVar1) goto LAB_00f36837;
            bVar1 = false;
            bVar2 = false;
            target = local_50;
          }
          if (bVar1) {
            LogicalType::~LogicalType(&local_48);
          }
          LogicalType::~LogicalType((LogicalType *)local_a0);
          if (bVar2 != false) goto LAB_00f369bc;
        }
        _Var4._M_cur = (__node_type *)((_Var4._M_cur)->super__Hash_node_base)._M_nxt;
      } while (_Var4._M_cur != (__node_type *)0x0);
    }
    _Var4._M_cur = (__node_type *)0x0;
    goto LAB_00f369bc;
  default:
    LogicalType::LogicalType((LogicalType *)local_a0,ANY);
    _Var4._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_00,(key_type *)local_a0);
    pLVar5 = (LogicalType *)local_a0;
    goto LAB_00f369b7;
  case UNION:
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
    ::pair<const_char_(&)[4],_const_duckdb::LogicalTypeId_&,_true>
              (local_a0,(char (*) [4])0x1dcb016,&LogicalType::ANY);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_a0;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_68,__l_00,(allocator_type *)&local_48);
    LogicalType::UNION(&local_b8,&local_68);
    _Var4._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_00,&local_b8);
    break;
  case ARRAY:
    LogicalType::LogicalType(&local_b8,ANY);
    LogicalType::ARRAY((LogicalType *)local_a0,&local_b8,(optional_idx)0xffffffffffffffff);
    _Var4._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_00,(key_type *)local_a0);
LAB_00f369a5:
    LogicalType::~LogicalType((LogicalType *)local_a0);
    pLVar5 = &local_b8;
LAB_00f369b7:
    LogicalType::~LogicalType(pLVar5);
    goto LAB_00f369bc;
  }
  LogicalType::~LogicalType(&local_b8);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_68);
  LogicalType::~LogicalType
            (&((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                *)local_a0)->second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_a0._1_7_,local_a0[0]) !=
      &(((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
          *)local_a0)->first).field_2) {
    operator_delete((void *)CONCAT71(local_a0._1_7_,local_a0[0]));
  }
LAB_00f369bc:
  if (_Var4._M_cur == (__node_type *)0x0) goto LAB_00f36c9d;
LAB_00f369c5:
  this_02 = (_Hashtable<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeIdEquality,_duckdb::LogicalTypeIdHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)((long)&((_Var4._M_cur)->
                       super__Hash_node_value<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>
                       ._M_storage._M_storage + 0x18);
  local_a0[0] = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                 )target->id_;
  _Var8._M_cur = (__node_type *)
                 ::std::
                 _Hashtable<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeIdEquality,_duckdb::LogicalTypeIdHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(this_02,(key_type *)local_a0);
  if (_Var8._M_cur == (__node_type *)0x0) {
    local_a0[0] = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                   )0x3;
    _Var8._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeIdEquality,_duckdb::LogicalTypeIdHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_02,(key_type *)local_a0);
    if (_Var8._M_cur == (__node_type *)0x0) goto LAB_00f36c9d;
  }
  this_01 = (_Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(&((_Var8._M_cur)->
                 super__Hash_node_value<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>
                 ._M_storage._M_storage.__align + 1);
  _Var9._M_cur = (__node_type *)
                 ::std::
                 _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(this_01,target);
  if (_Var9._M_cur != (__node_type *)0x0) goto LAB_00f36c97;
  switch(target->id_) {
  case STRUCT:
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
    ::pair<const_char_(&)[4],_const_duckdb::LogicalTypeId_&,_true>
              (local_a0,(char (*) [4])0x1dcb016,&LogicalType::ANY);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)local_a0;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_68,__l_01,&local_b9);
    LogicalType::STRUCT(&local_b8,&local_68);
    _Var9._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_01,&local_b8);
    break;
  case LIST:
    LogicalType::LogicalType(&local_b8,ANY);
    LogicalType::LIST((LogicalType *)local_a0,&local_b8);
    _Var9._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_01,(key_type *)local_a0);
    goto LAB_00f36c7b;
  case MAP:
    _Var9._M_cur = *(__node_type **)
                    ((long)&((_Var8._M_cur)->
                            super__Hash_node_value<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>
                            ._M_storage._M_storage + 0x18);
    if (_Var9._M_cur != (__node_type *)0x0) {
      do {
        if (((_Var9._M_cur)->
            super__Hash_node_value<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_true>)
            .super__Hash_node_value_base<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>
            ._M_storage._M_storage.__data[0] == 'f') {
          pLVar5 = MapType::KeyType((LogicalType *)
                                    &(_Var9._M_cur)->
                                     super__Hash_node_value<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_true>
                                   );
          pLVar6 = MapType::ValueType((LogicalType *)
                                      &(_Var9._M_cur)->
                                       super__Hash_node_value<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_true>
                                     );
          LogicalType::LogicalType((LogicalType *)local_a0,ANY);
          bVar1 = LogicalType::operator==(pLVar5,(LogicalType *)local_a0);
          if (bVar1) {
LAB_00f36b18:
            LogicalType::LogicalType(&local_b8,ANY);
            bVar2 = LogicalType::operator==(pLVar6,&local_b8);
            bVar1 = true;
            if (bVar2) {
              bVar2 = true;
            }
            else {
              pLVar5 = MapType::ValueType(target);
              bVar2 = LogicalType::operator==(pLVar6,pLVar5);
            }
          }
          else {
            pLVar7 = MapType::KeyType(target);
            bVar1 = LogicalType::operator==(pLVar5,pLVar7);
            if (bVar1) goto LAB_00f36b18;
            bVar1 = false;
            bVar2 = false;
          }
          if (bVar1) {
            LogicalType::~LogicalType(&local_b8);
          }
          LogicalType::~LogicalType((LogicalType *)local_a0);
          if (bVar2 != false) goto LAB_00f36c92;
        }
        _Var9._M_cur = (__node_type *)((_Var9._M_cur)->super__Hash_node_base)._M_nxt;
      } while (_Var9._M_cur != (__node_type *)0x0);
    }
    _Var9._M_cur = (__node_type *)0x0;
    goto LAB_00f36c92;
  default:
    LogicalType::LogicalType((LogicalType *)local_a0,ANY);
    _Var9._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_01,(key_type *)local_a0);
    pLVar5 = (LogicalType *)local_a0;
    goto LAB_00f36c8d;
  case UNION:
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
    ::pair<const_char_(&)[4],_const_duckdb::LogicalTypeId_&,_true>
              (local_a0,(char (*) [4])0x1dcb016,&LogicalType::ANY);
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)local_a0;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_68,__l_02,&local_b9);
    LogicalType::UNION(&local_b8,&local_68);
    _Var9._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_01,&local_b8);
    break;
  case ARRAY:
    LogicalType::LogicalType(&local_b8,ANY);
    LogicalType::ARRAY((LogicalType *)local_a0,&local_b8,(optional_idx)0xffffffffffffffff);
    _Var9._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_01,(key_type *)local_a0);
LAB_00f36c7b:
    LogicalType::~LogicalType((LogicalType *)local_a0);
    pLVar5 = &local_b8;
LAB_00f36c8d:
    LogicalType::~LogicalType(pLVar5);
    goto LAB_00f36c92;
  }
  LogicalType::~LogicalType(&local_b8);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_68);
  LogicalType::~LogicalType
            (&((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                *)local_a0)->second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_a0._1_7_,local_a0[0]) !=
      &(((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
          *)local_a0)->first).field_2) {
    operator_delete((void *)CONCAT71(local_a0._1_7_,local_a0[0]));
  }
LAB_00f36c92:
  if (_Var9._M_cur == (__node_type *)0x0) {
LAB_00f36c9d:
    pMVar10 = (MapCastNode *)0x0;
  }
  else {
LAB_00f36c97:
    pMVar10 = (MapCastNode *)
              ((long)&((_Var9._M_cur)->
                      super__Hash_node_value<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>
                      ._M_storage._M_storage + 0x18);
  }
  return (optional_ptr<duckdb::MapCastNode,_true>)pMVar10;
}

Assistant:

const optional_ptr<MapCastNode> GetEntry(const LogicalType &source, const LogicalType &target) {
		auto source_type_id_entry = casts.find(source.id());
		if (source_type_id_entry == casts.end()) {
			source_type_id_entry = casts.find(LogicalTypeId::ANY);
			if (source_type_id_entry == casts.end()) {
				return nullptr;
			}
		}

		auto &source_type_entries = source_type_id_entry->second;
		auto source_type_entry = source_type_entries.find(source);
		if (source_type_entry == source_type_entries.end()) {
			source_type_entry = RelaxedTypeMatch(source_type_entries, source);
			if (source_type_entry == source_type_entries.end()) {
				return nullptr;
			}
		}

		auto &target_type_id_entries = source_type_entry->second;
		auto target_type_id_entry = target_type_id_entries.find(target.id());
		if (target_type_id_entry == target_type_id_entries.end()) {
			target_type_id_entry = target_type_id_entries.find(LogicalTypeId::ANY);
			if (target_type_id_entry == target_type_id_entries.end()) {
				return nullptr;
			}
		}

		auto &target_type_entries = target_type_id_entry->second;
		auto target_type_entry = target_type_entries.find(target);
		if (target_type_entry == target_type_entries.end()) {
			target_type_entry = RelaxedTypeMatch(target_type_entries, target);
			if (target_type_entry == target_type_entries.end()) {
				return nullptr;
			}
		}

		return &target_type_entry->second;
	}